

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

bool __thiscall glcts::LayoutBindingProgram::compiledAndLinked(LayoutBindingProgram *this)

{
  ShaderProgram *pSVar1;
  int iVar2;
  
  iVar2 = (*this->_vptr_LayoutBindingProgram[2])();
  pSVar1 = this->m_program;
  if (iVar2 == 2) {
    if (((*pSVar1->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00be4ca3:
      return (pSVar1->m_program).m_info.linkOk;
    }
  }
  else if (((*pSVar1->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false)
  goto LAB_00be4ca3;
  return false;
}

Assistant:

bool compiledAndLinked() const
	{
		if (getStage() != ComputeShader)
			return m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk &&
				   m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk && m_program->getProgramInfo().linkOk;

		return m_program->getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk && m_program->getProgramInfo().linkOk;
	}